

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_nix.c
# Opt level: O2

int katherine_udp_recv_exact(katherine_udp_t *u,void *data,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  socklen_t addr_len;
  socklen_t local_34;
  
  uVar3 = 0;
  do {
    if (count < uVar3 || count - uVar3 == 0) {
      return 0;
    }
    sVar1 = recvfrom(u->sock,(void *)((long)data + uVar3),count - uVar3,0,
                     (sockaddr *)&u->addr_remote,&local_34);
    uVar3 = uVar3 + sVar1;
  } while (sVar1 != -1);
  piVar2 = __errno_location();
  return *piVar2;
}

Assistant:

int
katherine_udp_recv_exact(katherine_udp_t* u, void* data, size_t count)
{
    ssize_t received;
    size_t total = 0;
    socklen_t addr_len = sizeof(u->addr_remote);

    while (total < count) {
        received = recvfrom(u->sock, data + total, count - total, 0, (struct sockaddr *) &u->addr_remote, &addr_len);
        if (received == -1) {
            return errno;
        }

        total += received;
    }

#ifdef KATHERINE_DEBUG_UDP
    dump_buffer("Received:", data, received);
#endif /* KATHERINE_DEBUG_UDP */

    return 0;
}